

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O3

int iter_aux(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_Integer lVar3;
  long lVar4;
  int code;
  size_t len;
  int local_2c;
  size_t local_28;
  
  pcVar2 = luaL_checklstring(L,1,&local_28);
  iVar1 = 0;
  lVar3 = lua_tointegerx(L,2,(int *)0x0);
  lVar4 = 0;
  if ((0 < lVar3) && (lVar4 = lVar3, (long)local_28 < lVar3)) {
    lVar4 = lVar3 + -1;
  }
  if (lVar4 < (long)local_28) {
    pcVar2 = utf8_decode(pcVar2 + lVar4,&local_2c);
    if (pcVar2 == (char *)0x0) {
      iVar1 = luaL_error(L,"invalid UTF-8 code");
    }
    else {
      lua_pushinteger(L,lVar4 + 1);
      lua_pushinteger(L,(long)local_2c);
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

static int iter_aux (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n = lua_tointeger(L, 2) - 1;
  if (n < 0)  /* first iteration? */
    n = 0;  /* start from here */
  else if (n < (lua_Integer)len) {
    n++;  /* skip current byte */
    while (iscont(s + n)) n++;  /* and its continuations */
  }
  if (n >= (lua_Integer)len)
    return 0;  /* no more codepoints */
  else {
    int code;
    const char *next = utf8_decode(s + n, &code);
    if (next == NULL || iscont(next))
      return luaL_error(L, "invalid UTF-8 code");
    lua_pushinteger(L, n + 1);
    lua_pushinteger(L, code);
    return 2;
  }
}